

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O0

FieldDescriptor *
google::protobuf::compiler::java::anon_unknown_5::KeyField(FieldDescriptor *descriptor)

{
  Descriptor *this;
  bool bVar1;
  Type TVar2;
  MessageOptions *this_00;
  LogMessage *pLVar3;
  FieldDescriptor *pFVar4;
  allocator local_c9;
  string local_c8;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  Descriptor *local_68;
  Descriptor *message;
  byte local_49;
  LogMessage local_48;
  FieldDescriptor *local_10;
  FieldDescriptor *descriptor_local;
  
  local_10 = descriptor;
  TVar2 = FieldDescriptor::type(descriptor);
  local_49 = 0;
  if (TVar2 != TYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x31);
    local_49 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_48,
                        "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&message + 3),pLVar3);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  local_68 = FieldDescriptor::message_type(local_10);
  this_00 = Descriptor::options(local_68);
  bVar1 = MessageOptions::map_entry(this_00);
  local_a1 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x33);
    local_a1 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=(&local_a2,pLVar3);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  this = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"key",&local_c9);
  pFVar4 = Descriptor::FindFieldByName(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return pFVar4;
}

Assistant:

const FieldDescriptor* KeyField(const FieldDescriptor* descriptor) {
  GOOGLE_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  GOOGLE_CHECK(message->options().map_entry());
  return message->FindFieldByName("key");
}